

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdt.cc
# Opt level: O2

void __thiscall
dtc::fdt::property::parse_define(property *this,text_input_buffer *input,define_map *defines)

{
  __type _Var1;
  iterator iVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string name;
  
  text_input_buffer::consume(input,'$');
  if (defines == (define_map *)0x0) {
    text_input_buffer::parse_error(input,"No predefined properties to match name\n");
    this->valid = false;
    return;
  }
  text_input_buffer::parse_property_name_abi_cxx11_(&name,input);
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  local_60._M_string_length = 0;
  local_60.field_2._M_local_buf[0] = '\0';
  _Var1 = std::operator==(&name,&local_60);
  if (_Var1) {
    std::__cxx11::string::~string((string *)&local_60);
  }
  else {
    iVar2 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<dtc::fdt::property>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<dtc::fdt::property>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&defines->_M_h,&name);
    std::__cxx11::string::~string((string *)&local_60);
    if (iVar2.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<dtc::fdt::property>_>,_true>
        ._M_cur != (__node_type *)0x0) {
      std::vector<dtc::fdt::property_value,_std::allocator<dtc::fdt::property_value>_>::push_back
                (&this->values,
                 *(value_type **)
                  (*(long *)((long)iVar2.
                                   super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<dtc::fdt::property>_>,_true>
                                   ._M_cur + 0x28) + 0x58));
      goto LAB_0012ca25;
    }
  }
  text_input_buffer::parse_error(input,"Undefined property name\n");
  this->valid = false;
LAB_0012ca25:
  std::__cxx11::string::~string((string *)&name);
  return;
}

Assistant:

void property::parse_define(text_input_buffer &input, define_map *defines)
{
	input.consume('$');
	if (!defines)
	{
		input.parse_error("No predefined properties to match name\n");
		valid = false;
		return;
	}
	string name = input.parse_property_name();
	define_map::iterator found;
	if ((name == string()) ||
	    ((found = defines->find(name)) == defines->end()))
	{
		input.parse_error("Undefined property name\n");
		valid = false;
		return;
	}
	values.push_back((*found).second->values[0]);
}